

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::readArrayBasedContainer<QList<Qt::DayOfWeek>>(QDataStream *s,QList<Qt::DayOfWeek> *c)

{
  DayOfWeek DVar1;
  Status SVar2;
  undefined1 *asize;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  undefined8 local_58;
  uint local_4c;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_48,s);
  QList<Qt::DayOfWeek>::clear(c);
  local_4c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(qint32 *)&local_4c);
  asize = (undefined1 *)(ulong)local_4c;
  if (asize == (undefined1 *)0xffffffff) {
    asize = (undefined1 *)0xffffffffffffffff;
  }
  else if ((local_4c == 0xfffffffe) && (0x15 < s->ver)) {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,&local_58);
    asize = local_58;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus(s,SizeLimitExceeded);
  }
  else {
    QList<Qt::DayOfWeek>::reserve(c,(qsizetype)asize);
    while (asize != (undefined1 *)0x0) {
      asize = asize + -1;
      local_58._4_4_ = (undefined4)((ulong)local_58 >> 0x20);
      local_58 = (undefined1 *)CONCAT44(local_58._4_4_,0xaaaaaaaa);
      QDataStream::operator>>(s,(qint32 *)&local_58);
      DVar1 = (DayOfWeek)local_58;
      SVar2 = QDataStream::status(s);
      if (SVar2 != Ok) {
        QList<Qt::DayOfWeek>::clear(c);
        break;
      }
      local_58 = (undefined1 *)CONCAT44(local_58._4_4_,DVar1);
      QPodArrayOps<Qt::DayOfWeek>::emplace<Qt::DayOfWeek&>
                ((QPodArrayOps<Qt::DayOfWeek> *)c,(c->d).size,(DayOfWeek *)&local_58);
      QList<Qt::DayOfWeek>::end(c);
    }
  }
  if (local_48._8_4_ != Ok) {
    QDataStream::resetStatus((QDataStream *)local_48._0_8_);
    QDataStream::setStatus((QDataStream *)local_48._0_8_,local_48._8_4_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}